

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessible.cpp
# Opt level: O1

Id __thiscall QAccessibleEvent::uniqueId(QAccessibleEvent *this)

{
  int iVar1;
  Id IVar2;
  QAccessibleInterface *iface;
  undefined4 extraout_var;
  QDebug *pQVar3;
  long in_FS_OFFSET;
  QDebug local_48;
  Stream *local_40;
  QDebug local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_object == (QObject *)0x0) {
    IVar2 = (this->field_3).m_uniqueId;
  }
  else {
    iface = QAccessible::queryAccessibleInterface(this->m_object);
    IVar2 = 0;
    if (iface != (QAccessibleInterface *)0x0) {
      if ((this->field_3).m_child != -1) {
        iVar1 = (*iface->_vptr_QAccessibleInterface[9])(iface);
        iface = (QAccessibleInterface *)CONCAT44(extraout_var,iVar1);
        if (iface == (QAccessibleInterface *)0x0) {
          lcAccessibilityCore();
          IVar2 = 0;
          if (((byte)lcAccessibilityCore::category.field_2.bools.enabledWarning._q_value._M_base.
                     _M_i & 1) != 0) {
            QMessageLogger::warning();
            pQVar3 = QDebug::operator<<(&local_48,"Invalid child in QAccessibleEvent:");
            local_40 = pQVar3->stream;
            local_40->ref = local_40->ref + 1;
            ::operator<<((QDebug *)&local_38,(QObject *)&local_40);
            pQVar3 = QDebug::operator<<(&local_38,"child:");
            QDebug::operator<<(pQVar3,(this->field_3).m_child);
            QDebug::~QDebug(&local_38);
            QDebug::~QDebug((QDebug *)&local_40);
            QDebug::~QDebug(&local_48);
          }
          goto LAB_0058d41f;
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        IVar2 = QAccessible::uniqueId(iface);
        return IVar2;
      }
      goto LAB_0058d4eb;
    }
  }
LAB_0058d41f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return IVar2;
  }
LAB_0058d4eb:
  __stack_chk_fail();
}

Assistant:

QAccessible::Id QAccessibleEvent::uniqueId() const
{
    if (!m_object)
        return m_uniqueId;
    QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(m_object);
    if (!iface)
        return 0;
    if (m_child != -1) {
        iface = iface->child(m_child);
        if (Q_UNLIKELY(!iface)) {
            qCWarning(lcAccessibilityCore) << "Invalid child in QAccessibleEvent:" << m_object << "child:" << m_child;
            return 0;
        }
    }
    return QAccessible::uniqueId(iface);
}